

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

uint32_t FAudio_INTERNAL_GetBytesRequested(FAudioSourceVoice *voice,uint32_t decoding)

{
  FAudioWaveFormatEx *pFVar1;
  FAudioBufferEntry *list;
  FAudioWaveFormatExtensible *fmt;
  FAudioBuffer *buffer;
  uint32_t result;
  uint32_t end;
  uint32_t decoding_local;
  FAudioSourceVoice *voice_local;
  
  list = (voice->field_19).src.bufferList;
  decoding_local = decoding;
  do {
    if (list == (FAudioBufferEntry *)0x0 || decoding_local == 0) {
LAB_00130c89:
      if (((voice->field_19).src.format)->wFormatTag == 2) {
        pFVar1 = (voice->field_19).src.format;
        result = (decoding_local / pFVar1[1].wFormatTag +
                 (uint)(decoding_local % (uint)pFVar1[1].wFormatTag != 0)) *
                 (uint)((voice->field_19).src.format)->nBlockAlign;
      }
      else {
        result = decoding_local * ((voice->field_19).src.format)->nBlockAlign;
      }
      return result;
    }
    if ((list->buffer).LoopCount == 0) {
      end = ((list->buffer).PlayBegin + (list->buffer).PlayLength) -
            (voice->field_19).src.curBufferOffset;
    }
    else {
      end = (((list->buffer).LoopBegin + (list->buffer).LoopLength) -
            (voice->field_19).src.curBufferOffset) +
            (list->buffer).LoopLength * (list->buffer).LoopCount + -1 + (list->buffer).PlayLength;
    }
    if (decoding_local < end) {
      decoding_local = 0;
      goto LAB_00130c89;
    }
    decoding_local = decoding_local - end;
    list = list->next;
  } while( true );
}

Assistant:

static uint32_t FAudio_INTERNAL_GetBytesRequested(
	FAudioSourceVoice *voice,
	uint32_t decoding
) {
	uint32_t end, result;
	FAudioBuffer *buffer;
	FAudioWaveFormatExtensible *fmt;
	FAudioBufferEntry *list = voice->src.bufferList;

	LOG_FUNC_ENTER(voice->audio)

#ifdef HAVE_WMADEC
	if (voice->src.wmadec != NULL)
	{
		/* Always 0, per the spec */
		LOG_FUNC_EXIT(voice->audio)
		return 0;
	}
#endif /* HAVE_WMADEC */
	while (list != NULL && decoding > 0)
	{
		buffer = &list->buffer;
		if (buffer->LoopCount > 0)
		{
			end = (
				/* Current loop... */
				((buffer->LoopBegin + buffer->LoopLength) - voice->src.curBufferOffset) +
				/* Remaining loops... */
				(buffer->LoopLength * buffer->LoopCount - 1) +
				/* ... Final iteration */
				buffer->PlayLength
			);
		}
		else
		{
			end = (buffer->PlayBegin + buffer->PlayLength) - voice->src.curBufferOffset;
		}
		if (end > decoding)
		{
			decoding = 0;
			break;
		}
		decoding -= end;
		list = list->next;
	}

	/* Convert samples to bytes, factoring block alignment */
	if (voice->src.format->wFormatTag == FAUDIO_FORMAT_MSADPCM)
	{
		fmt = (FAudioWaveFormatExtensible*) voice->src.format;
		result = (
			(decoding / fmt->Samples.wSamplesPerBlock) +
			((decoding % fmt->Samples.wSamplesPerBlock) > 0)
		) * voice->src.format->nBlockAlign;
	}
	else
	{
		result = decoding * voice->src.format->nBlockAlign;
	}

	LOG_FUNC_EXIT(voice->audio)
	return result;
}